

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

CappedArray<char,_5UL> __thiscall kj::_::Stringifier::operator*(Stringifier *this,uchar i)

{
  ulong uVar1;
  size_t sVar2;
  uint8_t *puVar3;
  undefined7 in_register_00000031;
  CappedArray<char,_5UL> CVar4;
  uint8_t reverse [4];
  CappedArray<char,_5UL> result;
  
  result.currentSize = 5;
  if ((int)CONCAT71(in_register_00000031,i) == 0) {
    puVar3 = reverse + 1;
    reverse[0] = '\0';
  }
  else {
    puVar3 = reverse;
    for (uVar1 = (ulong)i; (int)uVar1 != 0; uVar1 = uVar1 / 10) {
      *puVar3 = (uint8_t)(uVar1 % 10);
      puVar3 = puVar3 + 1;
    }
  }
  sVar2 = 0;
  for (; reverse < puVar3; puVar3 = puVar3 + -1) {
    result.content[sVar2] = puVar3[-1] + '0';
    sVar2 = sVar2 + 1;
  }
  CVar4._8_8_ = result._8_8_ & 0xffffffffff;
  CVar4.currentSize = sVar2;
  return CVar4;
}

Assistant:

inline size_t size() const { return currentSize; }